

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O3

bool __thiscall llvm::detail::IEEEFloat::isLargest(IEEEFloat *this)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  Significand *pSVar5;
  
  if (((this->field_0x12 & 7) == 3 || (this->field_0x12 & 6) == 0) ||
     (this->exponent != this->semantics->maxExponent)) {
    return false;
  }
  uVar1 = this->semantics->precision;
  if (uVar1 - 0x40 < 0xffffff80) {
    pSVar5 = (Significand *)(this->significand).parts;
  }
  else {
    pSVar5 = &this->significand;
  }
  uVar3 = (uVar1 + 0x40 >> 6) - 1;
  if (uVar3 != 0) {
    uVar4 = 0;
    do {
      if (pSVar5[uVar4].part != 0xffffffffffffffff) {
        return false;
      }
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  iVar2 = (uVar1 + 0x40 & 0xffffffc0) - uVar1;
  if (iVar2 + 1U < 0x41) {
    return (-1L << (~(byte)iVar2 & 0x3f) | pSVar5[uVar3].part) == 0xffffffffffffffff;
  }
  __assert_fail("NumHighBits <= integerPartWidth && \"Can not have more high bits to \" \"fill than integerPartWidth\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x314,"bool llvm::detail::IEEEFloat::isSignificandAllOnes() const");
}

Assistant:

bool isNaN() const { return category == fcNaN; }